

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O0

bool miniros::names::operator!=(Path *a,Path *b)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  long in_RSI;
  undefined8 *in_RDI;
  size_t i;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  ulong local_20;
  bool local_1;
  
  sVar2 = std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)(in_RDI + 7));
  sVar3 = std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)(in_RSI + 0x38));
  if (sVar2 == sVar3) {
    for (local_20 = 0;
        sVar2 = std::
                vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)(in_RDI + 7)), local_20 < sVar2; local_20 = local_20 + 1) {
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)(in_RDI + 7),local_20);
      pvVar4 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)(in_RSI + 0x38),local_20);
      in_stack_ffffffffffffffc0 = (char *)pvVar4->_M_len;
      __x._M_str = in_stack_ffffffffffffffc0;
      __x._M_len = in_stack_ffffffffffffffb8;
      __y._M_str = in_stack_ffffffffffffffb0;
      __y._M_len = in_stack_ffffffffffffffa8;
      bVar1 = std::operator!=(__x,__y);
      if (bVar1) {
        return true;
      }
    }
    __x_00._M_str = in_stack_ffffffffffffffc0;
    __x_00._M_len = in_RDI[1];
    __y_00._M_str = (char *)*in_RDI;
    __y_00._M_len = *(size_t *)(in_RSI + 8);
    local_1 = std::operator!=(__x_00,__y_00);
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool operator != (const Path& a, const Path& b)
{
  if (a.m_ns.size() != b.m_ns.size())
    return true;

  for (size_t i = 0; i < a.m_ns.size(); i++) {
    if (a.m_ns[i] != b.m_ns[i])
      return true;
  }
  return a.m_lastName != b.m_lastName;
}